

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# task18.cpp
# Opt level: O0

int main(void)

{
  int iVar1;
  time_t tVar2;
  ostream *poVar3;
  int *num;
  int *__end1;
  int *__begin1;
  int (*__range1) [20];
  int max;
  int min;
  int array [20];
  
  memset(&max,0,0x50);
  __range1._4_4_ = 100;
  __range1._0_4_ = -100;
  tVar2 = time((time_t *)0x0);
  srand((uint)tVar2);
  for (__end1 = &max; __end1 != array + 0x12; __end1 = __end1 + 1) {
    iVar1 = rand();
    *__end1 = iVar1 % 0xc9 + -100;
    if (*__end1 < __range1._4_4_) {
      __range1._4_4_ = *__end1;
    }
    if ((int)__range1 < *__end1) {
      __range1._0_4_ = *__end1;
    }
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*__end1);
    std::operator<<(poVar3,' ');
  }
  poVar3 = (ostream *)
           std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,__range1._4_4_);
  poVar3 = std::operator<<(poVar3,' ');
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(int)__range1);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  return 0;
}

Assistant:

int main(){
    int array[20] = {};
    int min = 100, max = -100;
    srand(time(NULL)); // сид для генерации задаем текущим верменем
    for (int &num: array){
        num = rand() % 201 - 100; // получаем числа в [0 - 100; 200 - 100]
        if (min > num) min = num;
        if (max < num) max = num;
        cout << num << ' ';
    }
    cout << endl << min << ' ' << max << endl;
    return 0;
}